

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

void __thiscall BoardView::ShowInfoPane(BoardView *this)

{
  string *__rhs;
  float fVar1;
  ImVec2 IVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar4;
  pointer pcVar5;
  pointer psVar6;
  pointer psVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  char cVar13;
  bool bVar14;
  ImU32 col;
  EBoardSide extraout_EAX;
  EBoardSide extraout_EAX_00;
  EBoardSide EVar15;
  ImGuiIO *pIVar16;
  ImDrawList *this_01;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ImVec2 *pIVar17;
  undefined7 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  long *plVar19;
  ulong uVar20;
  ImVec2 IVar21;
  element_type *peVar22;
  undefined4 unaff_EBP;
  char cVar23;
  ulong __val;
  SharedVector<Component> *this_02;
  pointer psVar24;
  pointer psVar25;
  int iVar26;
  int iVar27;
  float fVar28;
  float fVar29;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar30;
  float fVar35;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  string __str;
  shared_ptr<Pin> pin;
  SharedVector<Component> *__range7;
  char bn [128];
  float local_524;
  ImVec2 local_518;
  ImVec2 local_510;
  long local_508;
  ImVec2 IStack_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  undefined1 local_4d8 [16];
  ImVec2 local_4c0;
  ImVec2 local_4b8;
  long local_4b0;
  ImVec2 IStack_4a8;
  ImVec2 *local_4a0;
  SharedVector<Component> *local_498;
  string local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  PDFBridgeEvince *local_450;
  pointer local_448;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_440;
  undefined1 local_438 [8];
  ImVec2 IStack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [63];
  
  pIVar16 = ImGui::GetIO();
  if ((this->config).showInfoPanel == true) {
    fVar1 = (pIVar16->DisplaySize).x;
    local_4a0 = &this->m_info_surface;
    local_4d8._0_4_ = (this->m_info_surface).x;
    fVar28 = DPIF(100.0);
    if ((float)local_4d8._0_4_ < fVar28) {
      fVar28 = DPIF(100.0);
      (this->m_info_surface).x = fVar28 + 1.0;
      (this->m_board_surface).x = fVar1 - (fVar28 + 1.0);
    }
    (this->m_info_surface).y = (this->m_board_surface).y;
    local_438._4_4_ = this->m_menu_height;
    local_438._0_4_ = fVar1 - (this->m_info_surface).x;
    local_518.x = 0.0;
    local_518.y = 0.0;
    ImGui::SetNextWindowPos((ImVec2 *)local_438,0,&local_518);
    ImGui::SetNextWindowSize(local_4a0,0);
    ImGui::PushStyleVar(4,1.0);
    ImGui::Begin("Info Panel",(bool *)0x0,0x127);
    if (this->m_dragging_token == 0) {
      fVar28 = (pIVar16->MousePos).x;
      fVar29 = (this->m_board_surface).x;
      if (fVar29 < fVar28) {
        local_4d8._0_4_ = fVar28;
        fVar28 = DPIF(12.0);
        if ((float)local_4d8._0_4_ < fVar29 + fVar28) {
          this_01 = ImGui::GetWindowDrawList();
          local_518.x = (this->m_board_surface).x;
          local_4d8 = ZEXT416((uint)local_518.x);
          local_518.y = this->m_menu_height;
          fVar28 = DPIF(12.0);
          local_4f8._M_dataplus._M_p =
               (pointer)CONCAT44(this->m_menu_height + (this->m_board_surface).y,
                                 fVar28 + (float)local_4d8._0_4_);
          local_438._0_4_ = 0.53333336;
          local_438._4_4_ = 0.53333336;
          IStack_430.x = 0.53333336;
          IStack_430.y = 0.53333336;
          col = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_438);
          ImDrawList::AddRectFilled(this_01,&local_518,(ImVec2 *)&local_4f8,col,0.0,0);
        }
      }
    }
    bVar14 = ImGui::IsMouseDragging(0,-1.0);
    if (bVar14) {
      if (this->m_dragging_token == 0) {
        fVar28 = pIVar16->MouseClickedPos[0].x;
        fVar29 = (this->m_board_surface).x;
        if (fVar29 < fVar28) {
          local_4d8._0_4_ = fVar28;
          fVar28 = DPIF(20.0);
          if ((float)local_4d8._0_4_ < fVar29 + fVar28) {
            this->m_dragging_token = 2;
          }
        }
      }
      if (this->m_dragging_token == 2) {
        IVar21 = ImGui::GetMouseDragDelta(0,-1.0);
        local_4d8._8_4_ = extraout_XMM0_Dc;
        local_4d8._0_4_ = IVar21.x;
        local_4d8._4_4_ = IVar21.y;
        local_4d8._12_4_ = extraout_XMM0_Dd;
        iVar26 = -(uint)(500.0 < ABS(IVar21.x));
        iVar27 = -(uint)(500.0 < ABS(IVar21.y));
        auVar10._4_4_ = iVar26;
        auVar10._0_4_ = iVar26;
        auVar10._8_4_ = iVar27;
        auVar10._12_4_ = iVar27;
        iVar26 = movmskpd(unaff_EBP,auVar10);
        ImGui::ResetMouseDragDelta(0);
        fVar28 = 0.0;
        if (iVar26 == 0) {
          fVar28 = (float)local_4d8._0_4_;
        }
        fVar30 = (this->m_board_surface).x + fVar28;
        (this->m_board_surface).x = fVar30;
        (this->m_info_surface).x = fVar1 - fVar30;
        fVar29 = fVar1 * 0.66;
        if (fVar30 < fVar29) {
          (this->m_board_surface).x = fVar29;
          (this->m_info_surface).x = fVar1 - fVar29;
        }
        if (0.0 < fVar28) {
          this->m_needsRedraw = true;
        }
      }
    }
    else {
      if (this->m_dragging_token == 2) {
        iVar26 = (int)(this->m_info_surface).x;
        (this->config).infoPanelWidth = iVar26;
        Confparse::WriteInt(&this->obvconfig,"infoPanelWidth",iVar26);
      }
      this->m_dragging_token = 0;
    }
    if (this->m_board == (Board *)0x0) {
      ImGui::Text("No board currently loaded.");
    }
    else {
      ImGui::Columns(2,(char *)0x0,true);
      iVar26 = (*this->m_board->_vptr_Board[4])();
      ImGui::Text("Pins: %zu",
                  ((long *)CONCAT44(extraout_var_00,iVar26))[1] -
                  *(long *)CONCAT44(extraout_var_00,iVar26) >> 4);
      iVar26 = (*this->m_board->_vptr_Board[3])();
      ImGui::Text("Parts: %zu",
                  ((long *)CONCAT44(extraout_var_01,iVar26))[1] -
                  *(long *)CONCAT44(extraout_var_01,iVar26) >> 4);
      ImGui::NextColumn();
      (*this->m_board->_vptr_Board[2])();
      ImGui::Text("Nets: %zu");
      ImGui::TextWrapped("Size: %0.2f x %0.2f\"",
                         SUB84((double)((float)this->m_boardWidth / 1000.0),0),
                         SUB84((double)((float)this->m_boardHeight / 1000.0),0));
      ImGui::Columns(1,(char *)0x0,true);
      ImGui::Separator();
      bVar14 = ImGui::Checkbox("Zoom on selected net",&(this->config).infoPanelCenterZoomNets);
      if (bVar14) {
        Confparse::WriteBool
                  (&this->obvconfig,"infoPanelCenterZoomNets",(this->config).infoPanelCenterZoomNets
                  );
      }
      bVar14 = ImGui::Checkbox("Select all parts on net",&(this->config).infoPanelSelectPartsOnNet);
      if (bVar14) {
        Confparse::WriteBool
                  (&this->obvconfig,"infoPanelSelectPartsOnNet",
                   (this->config).infoPanelSelectPartsOnNet);
      }
    }
    if ((this->m_partHighlighted).
        super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->m_partHighlighted).
        super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      ImGui::Separator();
      __val = (long)(this->m_partHighlighted).
                    super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_partHighlighted).
                    super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      cVar23 = '\x01';
      if (9 < __val) {
        uVar20 = __val;
        cVar13 = '\x04';
        do {
          cVar23 = cVar13;
          if (uVar20 < 100) {
            cVar23 = cVar23 + -2;
            goto LAB_00113553;
          }
          if (uVar20 < 1000) {
            cVar23 = cVar23 + -1;
            goto LAB_00113553;
          }
          if (uVar20 < 10000) goto LAB_00113553;
          bVar14 = 99999 < uVar20;
          uVar20 = uVar20 / 10000;
          cVar13 = cVar23 + '\x04';
        } while (bVar14);
        cVar23 = cVar23 + '\x01';
      }
LAB_00113553:
      local_518 = (ImVec2)&local_508;
      std::__cxx11::string::_M_construct((ulong)&local_518,cVar23);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_518,(uint)local_510.x,__val);
      pIVar17 = (ImVec2 *)std::__cxx11::string::append((char *)&local_518);
      IVar21 = (ImVec2)(pIVar17 + 2);
      if (*pIVar17 == IVar21) {
        local_428[0]._0_8_ = *(undefined8 *)IVar21;
        local_428[0]._8_8_ = pIVar17[3];
        local_438 = (undefined1  [8])local_428;
      }
      else {
        local_428[0]._0_8_ = *(undefined8 *)IVar21;
        local_438 = (undefined1  [8])*pIVar17;
      }
      IStack_430 = pIVar17[1];
      *pIVar17 = IVar21;
      pIVar17[1].x = 0.0;
      pIVar17[1].y = 0.0;
      *(undefined1 *)&pIVar17[2].x = 0;
      ImGui::TextUnformatted((char *)local_438,(char *)0x0);
      if (local_438 != (undefined1  [8])local_428) {
        operator_delete((void *)local_438,local_428[0]._M_allocated_capacity + 1);
      }
      if (local_518 != (ImVec2)&local_508) {
        operator_delete((void *)local_518,local_508 + 1);
      }
      psVar24 = (this->m_partHighlighted).
                super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_448 = (this->m_partHighlighted).
                  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar24 != local_448) {
        local_498 = &this->m_partHighlighted;
        local_450 = &this->pdfBridge;
        local_440 = &(this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
        do {
          peVar3 = (psVar24->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_4d8._0_8_ = psVar24;
          this_00 = (psVar24->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                    ._M_pi;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          ImGui::Text(" ");
          bVar14 = ImGui::SmallButton((peVar3->name)._M_dataplus._M_p);
          if (bVar14) {
            p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(extraout_var,bVar14);
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              p_Var18 = this_00;
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_00->_M_use_count = this_00->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_00->_M_use_count = this_00->_M_use_count + 1;
              }
            }
            EVar15 = (EBoardSide)p_Var18;
            if (peVar3 == (element_type *)0x0) {
              bVar14 = true;
            }
            else {
              EVar15 = (peVar3->super_BoardElement).board_side;
              bVar14 = EVar15 == kBoardSideBoth || EVar15 == this->m_current_side;
            }
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              EVar15 = extraout_EAX;
            }
            if (!bVar14) {
              FlipBoard(this,0);
              EVar15 = extraout_EAX_00;
            }
            local_524 = (peVar3->centerpoint).x;
            if ((local_524 != 0.0) || (NAN(local_524))) {
              fVar1 = (peVar3->centerpoint).y;
              if ((fVar1 == 0.0) && (!NAN(fVar1))) goto LAB_001137dd;
              fVar28 = this->m_scale;
              IVar21 = (peVar3->outline)._M_elems[0];
              IVar2 = (peVar3->outline)._M_elems[2];
              auVar31._0_4_ = fVar28 * ABS(IVar2.x - IVar21.x);
              auVar31._4_4_ = fVar28 * ABS(IVar2.y - IVar21.y);
              auVar31._8_4_ = fVar28 * 0.0;
              auVar31._12_4_ = fVar28 * 0.0;
              IVar21 = this->m_board_surface;
              fVar29 = IVar21.x;
              fVar30 = IVar21.y;
              auVar8._8_8_ = 0;
              auVar8._0_4_ = IVar21.x;
              auVar8._4_4_ = IVar21.y;
              auVar32 = divps(auVar31,auVar8);
              fVar35 = auVar32._4_4_;
              iVar26 = -(uint)(1.0 < auVar32._0_4_);
              auVar11._4_4_ = iVar26;
              auVar11._0_4_ = iVar26;
              auVar11._8_4_ = -(uint)(1.0 < fVar35);
              auVar11._12_4_ = -(uint)(1.0 < fVar35);
              iVar26 = movmskpd(EVar15,auVar11);
              if (iVar26 != 0) {
                if (auVar32._0_4_ <= fVar35) {
                  auVar32._0_4_ = fVar35;
                }
                this->m_scale = fVar28 / (auVar32._0_4_ * (this->config).partZoomScaleOutFactor);
              }
            }
            else {
LAB_001137dd:
              lVar4 = *(long *)&((peVar3->pins).
                                 super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                                super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>;
              local_524 = *(float *)(lVar4 + 0x50);
              fVar1 = *(float *)(lVar4 + 0x54);
              fVar29 = (this->m_board_surface).x;
              fVar30 = (this->m_board_surface).y;
            }
            IVar21 = ScreenToCoord(this,fVar29 * 0.5,fVar30 * 0.5,1.0);
            this->m_dx = (IVar21.x - local_524) + this->m_dx;
            this->m_dy = (IVar21.y - fVar1) + this->m_dy;
            this->m_needsRedraw = true;
          }
          ImGui::SameLine(0.0,-1.0);
          __rhs = &peVar3->name;
          snprintf(local_438,0x80,"Z##%s",(__rhs->_M_dataplus)._M_p);
          bVar14 = ImGui::SmallButton(local_438);
          if (bVar14) {
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_00->_M_use_count = this_00->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_00->_M_use_count = this_00->_M_use_count + 1;
              }
            }
            if (peVar3 == (element_type *)0x0) {
              bVar14 = true;
            }
            else {
              EVar15 = (peVar3->super_BoardElement).board_side;
              bVar14 = EVar15 == kBoardSideBoth || EVar15 == this->m_current_side;
            }
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
            if (!bVar14) {
              FlipBoard(this,0);
            }
            local_524 = (peVar3->centerpoint).x;
            if ((local_524 != 0.0) || (NAN(local_524))) {
              fVar1 = (peVar3->centerpoint).y;
              if ((fVar1 == 0.0) && (!NAN(fVar1))) goto LAB_00113997;
              fVar28 = this->m_scale;
              IVar21 = (peVar3->outline)._M_elems[0];
              IVar2 = (peVar3->outline)._M_elems[2];
              auVar33._0_4_ = fVar28 * ABS(IVar2.x - IVar21.x);
              auVar33._4_4_ = fVar28 * ABS(IVar2.y - IVar21.y);
              auVar33._8_4_ = fVar28 * 0.0;
              auVar33._12_4_ = fVar28 * 0.0;
              IVar21 = this->m_board_surface;
              fVar29 = IVar21.x;
              fVar30 = IVar21.y;
              auVar9._8_8_ = 0;
              auVar9._0_4_ = IVar21.x;
              auVar9._4_4_ = IVar21.y;
              auVar34 = divps(auVar33,auVar9);
              if (auVar34._0_4_ <= auVar34._4_4_) {
                auVar34._0_4_ = auVar34._4_4_;
              }
              this->m_scale = fVar28 / (auVar34._0_4_ * (this->config).partZoomScaleOutFactor);
            }
            else {
LAB_00113997:
              lVar4 = *(long *)&((peVar3->pins).
                                 super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                                super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>;
              local_524 = *(float *)(lVar4 + 0x50);
              fVar1 = *(float *)(lVar4 + 0x54);
              fVar29 = (this->m_board_surface).x;
              fVar30 = (this->m_board_surface).y;
            }
            IVar21 = ScreenToCoord(this,fVar29 * 0.5,fVar30 * 0.5,1.0);
            this->m_dx = (IVar21.x - local_524) + this->m_dx;
            this->m_dy = (IVar21.y - fVar1) + this->m_dy;
            this->m_needsRedraw = true;
          }
          ImGui::SameLine(0.0,-1.0);
          ImGui::Text("%zu Pin(s)",
                      (long)(peVar3->pins).
                            super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(peVar3->pins).
                            super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4);
          ImGui::SameLine(0.0,-1.0);
          snprintf(local_438,0x80,"Copy##%s",(__rhs->_M_dataplus)._M_p);
          bVar14 = ImGui::SmallButton(local_438);
          if (bVar14) {
            pcVar5 = (peVar3->name)._M_dataplus._M_p;
            local_518 = (ImVec2)&local_508;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_518,pcVar5,pcVar5 + (peVar3->name)._M_string_length);
            if ((peVar3->mfgcode)._M_string_length != 0) {
              std::operator+(&local_4f8," ",&peVar3->mfgcode);
              std::__cxx11::string::_M_append((char *)&local_518,(ulong)local_4f8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                operator_delete(local_4f8._M_dataplus._M_p,
                                local_4f8.field_2._M_allocated_capacity + 1);
              }
            }
            psVar6 = (peVar3->pins).
                     super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (psVar25 = (peVar3->pins).
                           super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; psVar25 != psVar6;
                psVar25 = psVar25 + 1) {
              std::operator+(&local_470,"\n",
                             &((psVar25->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                              )->name);
              pIVar17 = (ImVec2 *)std::__cxx11::string::append((char *)&local_470);
              local_4c0 = (ImVec2)&local_4b0;
              IVar21 = (ImVec2)(pIVar17 + 2);
              if (*pIVar17 == IVar21) {
                local_4b0 = *(long *)IVar21;
                IStack_4a8 = pIVar17[3];
              }
              else {
                local_4b0 = *(long *)IVar21;
                local_4c0 = *pIVar17;
              }
              local_4b8 = pIVar17[1];
              *pIVar17 = IVar21;
              pIVar17[1].x = 0.0;
              pIVar17[1].y = 0.0;
              *(undefined1 *)&pIVar17[2].x = 0;
              plVar19 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_4c0,
                                           (ulong)(((psVar25->
                                                                                                        
                                                  super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr)->net->name)._M_dataplus._M_p);
              local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
              peVar22 = (element_type *)(plVar19 + 2);
              if ((element_type *)*plVar19 == peVar22) {
                local_4f8.field_2._M_allocated_capacity =
                     (size_type)(peVar22->super_BoardElement)._vptr_BoardElement;
                local_4f8.field_2._8_8_ = plVar19[3];
              }
              else {
                local_4f8.field_2._M_allocated_capacity =
                     (size_type)(peVar22->super_BoardElement)._vptr_BoardElement;
                local_4f8._M_dataplus._M_p = (pointer)*plVar19;
              }
              local_4f8._M_string_length = plVar19[1];
              *plVar19 = (long)peVar22;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_518,(ulong)local_4f8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                operator_delete(local_4f8._M_dataplus._M_p,
                                local_4f8.field_2._M_allocated_capacity + 1);
              }
              if (local_4c0 != (ImVec2)&local_4b0) {
                operator_delete((void *)local_4c0,local_4b0 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_470._M_dataplus._M_p != &local_470.field_2) {
                operator_delete(local_470._M_dataplus._M_p,
                                local_470.field_2._M_allocated_capacity + 1);
              }
            }
            ImGui::SetClipboardText((char *)local_518);
            if (local_518 != (ImVec2)&local_508) {
              operator_delete((void *)local_518,local_508 + 1);
            }
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_438,"PDF Search##",__rhs);
          bVar14 = ImGui::SmallButton((char *)local_438);
          if (bVar14) {
            PDFBridgeEvince::DocumentSearch
                      (local_450,__rhs,ShowInfoPane::wholeWordsOnly,ShowInfoPane::caseSensitive);
          }
          ImGui::SameLine(0.0,-1.0);
          ImGui::Checkbox("Whole words only",&ShowInfoPane::wholeWordsOnly);
          ImGui::SameLine(0.0,-1.0);
          ImGui::Checkbox("Case sensitive",&ShowInfoPane::caseSensitive);
          if (local_438 != (undefined1  [8])local_428) {
            operator_delete((void *)local_438,local_428[0]._M_allocated_capacity + 1);
          }
          if ((peVar3->mfgcode)._M_string_length != 0) {
            ImGui::TextWrapped("%s",(peVar3->mfgcode)._M_dataplus._M_p);
          }
          ImGui::PushItemWidth(-1.0);
          local_438 = (undefined1  [8])local_428;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"##","");
          pIVar17 = (ImVec2 *)
                    std::__cxx11::string::_M_append
                              ((char *)local_438,(ulong)(peVar3->name)._M_dataplus._M_p);
          IVar21 = (ImVec2)(pIVar17 + 2);
          if (*pIVar17 == IVar21) {
            local_508 = *(long *)IVar21;
            IStack_500 = pIVar17[3];
            local_518 = (ImVec2)&local_508;
          }
          else {
            local_508 = *(long *)IVar21;
            local_518 = *pIVar17;
          }
          local_510 = pIVar17[1];
          *pIVar17 = IVar21;
          pIVar17[1].x = 0.0;
          pIVar17[1].y = 0.0;
          *(undefined1 *)&pIVar17[2].x = 0;
          if (local_438 != (undefined1  [8])local_428) {
            operator_delete((void *)local_438,local_428[0]._M_allocated_capacity + 1);
          }
          local_4c0.x = 0.0;
          local_4c0.y = 0.0;
          psVar25 = (peVar3->pins).
                    super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          psVar6 = (peVar3->pins).
                   super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          fVar1 = local_4a0->x;
          fVar28 = DPIF(50.0);
          fVar29 = ImGui::GetFontSize();
          iVar26 = (int)((ulong)((long)psVar25 - (long)psVar6) >> 4);
          if (0x13 < iVar26) {
            iVar26 = 0x14;
          }
          local_4c0.y = fVar29 * (float)iVar26 * 1.45;
          local_4c0.x = fVar1 - fVar28;
          bVar14 = ImGui::BeginListBox((char *)local_518,&local_4c0);
          if (bVar14) {
            psVar6 = (peVar3->pins).
                     super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            this_02 = local_498;
            for (psVar25 = (peVar3->pins).
                           super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; psVar25 != psVar6;
                psVar25 = psVar25 + 1) {
              local_4f8._M_dataplus._M_p =
                   (pointer)(psVar25->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_4f8._M_string_length =
                   (size_type)
                   (psVar25->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8._M_string_length)->
                  _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_4f8._M_string_length)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8._M_string_length)->
                  _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_4f8._M_string_length)->_M_use_count + 1;
                }
              }
              snprintf(local_438,0x400,"%4s  %s",
                       (((element_type *)local_4f8._M_dataplus._M_p)->name)._M_dataplus._M_p,
                       (((element_type *)local_4f8._M_dataplus._M_p)->net->name)._M_dataplus._M_p);
              local_470._M_dataplus._M_p = (pointer)0x0;
              bVar14 = ImGui::Selectable(local_438,
                                         (element_type *)local_4f8._M_dataplus._M_p ==
                                         (this->m_pinSelected).
                                         super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                                         0,(ImVec2 *)&local_470);
              if (bVar14) {
                ClearAllHighlights(this);
                if ((*(uint *)(local_4f8._M_dataplus._M_p + 0xc) < 2) ||
                   ((*(Net **)(local_4f8._M_dataplus._M_p + 0x60))->is_ground == true)) {
                  std::
                  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
                  push_back(this_02,(shared_ptr<Component> *)(local_4f8._M_dataplus._M_p + 0x68));
                }
                else {
                  (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)local_4f8._M_dataplus._M_p;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                            (local_440,
                             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &local_4f8._M_string_length);
                  psVar7 = (this->m_partHighlighted).
                           super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (psVar24 = (this->m_partHighlighted).
                                 super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start; this_02 = local_498,
                      psVar24 != psVar7; psVar24 = psVar24 + 1) {
                    p_Var18 = (psVar24->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>).
                              _M_refcount._M_pi;
                    if (p_Var18 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ((((shared_ptr<Component> *)(local_4f8._M_dataplus._M_p + 0x68))->
                       super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                      visualmode = '\0';
                    }
                    else {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
                      }
                      ((((shared_ptr<Component> *)(local_4f8._M_dataplus._M_p + 0x68))->
                       super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                      visualmode = '\0';
                      if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
                      }
                    }
                  }
                  std::
                  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
                  push_back(local_498,(shared_ptr<Component> *)(local_4f8._M_dataplus._M_p + 0x68));
                  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                  pcVar5 = ((*(Net **)(local_4f8._M_dataplus._M_p + 0x60))->name)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_490,pcVar5,
                             pcVar5 + ((*(Net **)(local_4f8._M_dataplus._M_p + 0x60))->name).
                                      _M_string_length);
                  CenterZoomNet(this,&local_490);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_490._M_dataplus._M_p != &local_490.field_2) {
                    operator_delete(local_490._M_dataplus._M_p,
                                    local_490.field_2._M_allocated_capacity + 1);
                  }
                }
                this->m_needsRedraw = true;
              }
              ImGui::PushStyleColor(5,0xffeeeeee);
              ImGui::Separator();
              ImGui::PopStyleColor(1);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_4f8._M_string_length);
              }
            }
            ImGui::EndListBox();
          }
          ImGui::PopItemWidth();
          if (local_518 != (ImVec2)&local_508) {
            operator_delete((void *)local_518,local_508 + 1);
          }
          uVar12 = local_4d8._0_8_;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          psVar24 = (pointer)(uVar12 + 0x10);
        } while (psVar24 != local_448);
      }
      ImGui::Text(" ");
      ImGui::Separator();
      ImGui::Separator();
      ImGui::Separator();
    }
    ImGui::End();
    ImGui::PopStyleVar(1);
  }
  return;
}

Assistant:

void BoardView::ShowInfoPane(void) {
	ImGuiIO &io = ImGui::GetIO();
	ImVec2 ds   = io.DisplaySize;

	if (!config.showInfoPanel) return;

	if (m_info_surface.x < DPIF(100)) {
		//	fprintf(stderr,"Too small (%f), set to (%f)\n", width, DPIF(100));
		m_info_surface.x  = DPIF(100) + 1;
		m_board_surface.x = ds.x - m_info_surface.x;
	}

	m_info_surface.y = m_board_surface.y;

	/*
	 * Originally the dialog was to follow the cursor but it proved to be an overkill
	 * to try adjust things to keep it within the bounds of the window so as to not
	 * lose the buttons.
	 *
	 * Now it's kept at a fixed point.
	 */
	ImGui::SetNextWindowPos(ImVec2(ds.x - m_info_surface.x, m_menu_height));
	ImGui::SetNextWindowSize(m_info_surface);
	ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 1.0f);
	ImGui::Begin("Info Panel",
	             NULL,
	             ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoResize |
	                 ImGuiWindowFlags_NoSavedSettings);

	if ((m_dragging_token == 0) && (io.MousePos.x > m_board_surface.x) && (io.MousePos.x < (m_board_surface.x + DPIF(12.0f)))) {
		ImDrawList *draw = ImGui::GetWindowDrawList();
		draw->AddRectFilled(ImVec2(m_board_surface.x, m_menu_height),
		                    ImVec2(m_board_surface.x + DPIF(12.0f), m_board_surface.y + m_menu_height),
		                    ImColor(0x88888888));
		//			DrawHex( draw, io.MousePos, DPIF(10.0f), ImColor(0xFF0000FF) );
	}

	if (ImGui::IsMouseDragging(0)) {
		if ((m_dragging_token == 0) && (io.MouseClickedPos[0].x > m_board_surface.x) &&
		    (io.MouseClickedPos[0].x < (m_board_surface.x + DPIF(20.0f))))
			m_dragging_token = 2; // own it.
		if (m_dragging_token == 2) {
			ImVec2 delta = ImGui::GetMouseDragDelta();
			if ((abs(delta.x) > 500) || (abs(delta.y) > 500)) {
				delta.x = 0;
				delta.y = 0;
			} // If the delta values are crazy just drop them (happens when panning
			// off screen). 500 arbritary chosen
			ImGui::ResetMouseDragDelta();
			m_board_surface.x += delta.x;
			m_info_surface.x = ds.x - m_board_surface.x;
			if (m_board_surface.x < ds.x * 0.66) {
				m_board_surface.x = ds.x * 0.66;
				m_info_surface.x  = ds.x - m_board_surface.x;
			}
			if (delta.x > 0) m_needsRedraw = true;
		}
	} else {
		if (m_dragging_token == 2) {
			config.infoPanelWidth = m_info_surface.x;
			obvconfig.WriteInt("infoPanelWidth", m_info_surface.x);
		}
		m_dragging_token = 0;
	}

	if (m_board) {
		ImGui::Columns(2);
		ImGui::Text("Pins: %zu", m_board->Pins().size());
		ImGui::Text("Parts: %zu", m_board->Components().size());
		ImGui::NextColumn();
		ImGui::Text("Nets: %zu", m_board->Nets().size());
		ImGui::TextWrapped("Size: %0.2f x %0.2f\"", m_boardWidth / 1000.0f, m_boardHeight / 1000.0f);
		ImGui::Columns(1);
		ImGui::Separator();
		if (ImGui::Checkbox("Zoom on selected net", &config.infoPanelCenterZoomNets)) {
			obvconfig.WriteBool("infoPanelCenterZoomNets", config.infoPanelCenterZoomNets);
		}
		if (ImGui::Checkbox("Select all parts on net", &config.infoPanelSelectPartsOnNet)) {
			obvconfig.WriteBool("infoPanelSelectPartsOnNet", config.infoPanelSelectPartsOnNet);
		}
	} else {
		ImGui::Text("No board currently loaded.");
	}

	if (m_partHighlighted.size()) {
		ImGui::Separator();
		ImGui::TextUnformatted((std::to_string(m_partHighlighted.size()) + " parts selected").c_str());

		for (auto part : m_partHighlighted) {

			ImGui::Text(" ");

			if (ImGui::SmallButton(part->name.c_str())) {
				if (!BoardElementIsVisible(part)) FlipBoard();
				if (part->centerpoint.x && part->centerpoint.y) {
					ImVec2 psz;

					/*
					 * Check to see if we need to zoom BACK a bit to fit the part in to view
					 */
					psz = ImVec2(abs(part->outline[2].x - part->outline[0].x) * m_scale / m_board_surface.x,
					             abs(part->outline[2].y - part->outline[0].y) * m_scale / m_board_surface.y);
					if ((psz.x > 1) || (psz.y > 1)) {
						if (psz.x > psz.y) {
							m_scale /= (config.partZoomScaleOutFactor * psz.x);
						} else {
							m_scale /= (config.partZoomScaleOutFactor * psz.y);
						}
					}

					SetTarget(part->centerpoint.x, part->centerpoint.y);
				} else {
					SetTarget(part->pins[0]->position.x, part->pins[0]->position.y);
				}
				m_needsRedraw = 1;
			}
			ImGui::SameLine();
			{
				char bn[128];
				snprintf(bn, sizeof(bn), "Z##%s", part->name.c_str());
				if (ImGui::SmallButton(bn)) {
					if (!BoardElementIsVisible(part)) FlipBoard();
					if (part->centerpoint.x && part->centerpoint.y) {
						ImVec2 psz;

						/*
						 * Check to see if we need to zoom BACK a bit to fit the part in to view
						 */
						psz = ImVec2(abs(part->outline[2].x - part->outline[0].x) * m_scale / m_board_surface.x,
						             abs(part->outline[2].y - part->outline[0].y) * m_scale / m_board_surface.y);
						if (psz.x > psz.y) {
							m_scale /= (config.partZoomScaleOutFactor * psz.x);
						} else {
							m_scale /= (config.partZoomScaleOutFactor * psz.y);
						}

						SetTarget(part->centerpoint.x, part->centerpoint.y);
					} else {
						SetTarget(part->pins[0]->position.x, part->pins[0]->position.y);
					}
					m_needsRedraw = 1;
				}
			}

			ImGui::SameLine();
			ImGui::Text("%zu Pin(s)", part->pins.size());
			ImGui::SameLine();
			{
				char name_and_id[128];
				snprintf(name_and_id, sizeof(name_and_id), "Copy##%s", part->name.c_str());
				if (ImGui::SmallButton(name_and_id)) {
					// std::string speed is no concern here, since button action is not in UI rendering loop
					std::string to_copy = part->name;
					if (part->mfgcode.size()) {
						to_copy += " " + part->mfgcode;
					}
					for (const auto &pin : part->pins) {
						to_copy += "\n" + pin->name + " " + pin->net->name;
					}
					ImGui::SetClipboardText(to_copy.c_str());
				}
			}

			{
				static bool wholeWordsOnly = true;
				static bool caseSensitive = false;
				std::string pdfButtonName = "PDF Search##" + part->name;
				if (ImGui::SmallButton(pdfButtonName.c_str())) {
					pdfBridge.DocumentSearch(part->name, wholeWordsOnly, caseSensitive);
				}
				ImGui::SameLine();
				ImGui::Checkbox("Whole words only", &wholeWordsOnly);
				ImGui::SameLine();
				ImGui::Checkbox("Case sensitive", &caseSensitive);
			}

			if (part->mfgcode.size()) ImGui::TextWrapped("%s", part->mfgcode.c_str());

			/*
			 * Generate the pin# and net table
			 */
			ImGui::PushItemWidth(-1);
			std::string str = std::string("##") + part->name;
			ImVec2 listSize;
			int pc = part->pins.size();
			if (pc > 20) pc = 20;
			listSize = ImVec2(m_info_surface.x - DPIF(50), pc * ImGui::GetFontSize() * 1.45);
			if (ImGui::BeginListBox(str.c_str(), listSize)) { //, ImVec2(m_board_surface.x/3 -5, m_board_surface.y/2));
				for (auto pin : part->pins) {
					char ss[1024];
					snprintf(ss, sizeof(ss), "%4s  %s", pin->name.c_str(), pin->net->name.c_str());
					if (ImGui::Selectable(ss, (pin == m_pinSelected))) {
						ClearAllHighlights();

						if ((pin->type == Pin::kPinTypeNotConnected) || (pin->type == Pin::kPinTypeUnkown) || (pin->net->is_ground)) {
							m_partHighlighted.push_back(pin->component);
							// do nothing for now
							//
						} else {
							m_pinSelected = pin;
							for (auto p : m_partHighlighted) {
								pin->component->visualmode = pin->component->CVMNormal;
							};
							m_partHighlighted.push_back(pin->component);
							CenterZoomNet(pin->net->name);
						}
						m_needsRedraw = true;
					}
					ImGui::PushStyleColor(ImGuiCol_Border, 0xffeeeeee);
					ImGui::Separator();
					ImGui::PopStyleColor();
				}
				ImGui::EndListBox();
			}
			ImGui::PopItemWidth();

		} // for each part in the list
		ImGui::Text(" ");
		ImGui::Separator();
		ImGui::Separator();
		ImGui::Separator();
	}

	ImGui::End();
	ImGui::PopStyleVar();
}